

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_range_cardinality
                   (roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  bool bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  run_container_t *prVar10;
  ushort uVar11;
  long lVar12;
  uint uVar13;
  uint64_t uVar14;
  ushort uVar15;
  ulong uVar16;
  
  uVar16 = 0x100000000;
  if (range_end < 0x100000000) {
    uVar16 = range_end;
  }
  if (range_start < uVar16) {
    lVar12 = uVar16 - 1;
    iVar7 = (r->high_low_container).size;
    uVar15 = (ushort)(range_start >> 0x10);
    if (((long)iVar7 == 0) ||
       (puVar2 = (r->high_low_container).keys, puVar2[(long)iVar7 + -1] == uVar15)) {
      uVar13 = iVar7 - 1;
    }
    else {
      uVar8 = iVar7 - 1;
      uVar9 = 0;
      uVar6 = uVar8;
      do {
        if ((int)uVar8 < (int)uVar9) {
          uVar13 = ~uVar9;
          break;
        }
        uVar13 = uVar9 + uVar8 >> 1;
        uVar11 = *(ushort *)((long)puVar2 + (ulong)(uVar9 + uVar8 & 0xfffffffe));
        if (uVar11 < uVar15) {
          uVar9 = uVar13 + 1;
          bVar3 = true;
          uVar13 = uVar6;
        }
        else if (uVar15 < uVar11) {
          uVar8 = uVar13 - 1;
          bVar3 = true;
          uVar13 = uVar6;
        }
        else {
          bVar3 = false;
        }
        uVar6 = uVar13;
      } while (bVar3);
    }
    uVar11 = (ushort)lVar12;
    if ((int)uVar13 < 0) {
      uVar13 = ~uVar13;
      uVar14 = 0;
    }
    else {
      prVar10 = (run_container_t *)(r->high_low_container).containers[uVar13];
      bVar4 = (r->high_low_container).typecodes[uVar13];
      if (uVar15 == (ushort)((ulong)lVar12 >> 0x10)) {
        if (bVar4 == 4) {
          bVar4 = *(byte *)&prVar10->runs;
          prVar10 = *(run_container_t **)prVar10;
        }
        if (bVar4 == 3) {
          uVar6 = run_container_rank(prVar10,uVar11);
        }
        else if (bVar4 == 2) {
          iVar7 = prVar10->n_runs + -1;
          uVar9 = 0;
          uVar6 = (uint)bVar4;
          do {
            if (iVar7 < (int)uVar9) {
              uVar8 = ~uVar9;
              break;
            }
            uVar8 = uVar9 + iVar7 >> 1;
            uVar15 = *(ushort *)((long)&prVar10->runs->value + (ulong)(uVar9 + iVar7 & 0xfffffffe));
            if (uVar15 < uVar11) {
              uVar9 = uVar8 + 1;
              bVar3 = true;
              uVar8 = uVar6;
            }
            else if (uVar11 < uVar15) {
              iVar7 = uVar8 - 1;
              bVar3 = true;
              uVar8 = uVar6;
            }
            else {
              bVar3 = false;
            }
            uVar6 = uVar8;
          } while (bVar3);
          uVar6 = ~uVar8;
          if (-1 < (int)uVar8) {
            uVar6 = uVar8 + 1;
          }
        }
        else {
          uVar6 = bitset_container_rank((bitset_container_t *)prVar10,uVar11);
        }
      }
      else {
        if (bVar4 == 4) {
          bVar4 = *(byte *)&prVar10->runs;
          prVar10 = *(run_container_t **)prVar10;
        }
        if (bVar4 == 3) {
          uVar6 = run_container_cardinality(prVar10);
        }
        else {
          uVar6 = prVar10->n_runs;
        }
      }
      uVar14 = (uint64_t)(int)uVar6;
      if ((short)range_start != 0) {
        prVar10 = (run_container_t *)(r->high_low_container).containers[uVar13];
        bVar4 = (r->high_low_container).typecodes[uVar13];
        uVar15 = (short)range_start - 1;
        if (bVar4 == 4) {
          bVar4 = *(byte *)&prVar10->runs;
          prVar10 = *(run_container_t **)prVar10;
        }
        if (bVar4 == 3) {
          uVar6 = run_container_rank(prVar10,uVar15);
        }
        else if (bVar4 == 2) {
          iVar7 = prVar10->n_runs + -1;
          uVar9 = 0;
          uVar6 = (uint)bVar4;
          do {
            if (iVar7 < (int)uVar9) {
              uVar8 = ~uVar9;
              break;
            }
            uVar8 = uVar9 + iVar7 >> 1;
            uVar1 = *(ushort *)((long)&prVar10->runs->value + (ulong)(uVar9 + iVar7 & 0xfffffffe));
            if (uVar1 < uVar15) {
              uVar9 = uVar8 + 1;
              bVar3 = true;
              uVar8 = uVar6;
            }
            else if (uVar15 < uVar1) {
              iVar7 = uVar8 - 1;
              bVar3 = true;
              uVar8 = uVar6;
            }
            else {
              bVar3 = false;
            }
            uVar6 = uVar8;
          } while (bVar3);
          uVar6 = ~uVar8;
          if (-1 < (int)uVar8) {
            uVar6 = uVar8 + 1;
          }
        }
        else {
          uVar6 = bitset_container_rank((bitset_container_t *)prVar10,uVar15);
        }
        uVar14 = uVar14 - (long)(int)uVar6;
      }
      uVar13 = uVar13 + 1;
    }
    if ((int)uVar13 < (r->high_low_container).size) {
      uVar6 = (uint)((ulong)lVar12 >> 0x10) & 0xffff;
      uVar16 = (ulong)uVar13;
      do {
        uVar15 = (r->high_low_container).keys[uVar16];
        if (uVar15 < uVar6) {
          prVar10 = (run_container_t *)(r->high_low_container).containers[uVar16];
          uVar5 = (r->high_low_container).typecodes[uVar16];
          if (uVar5 == '\x04') {
            uVar5 = *(uint8_t *)&prVar10->runs;
            prVar10 = *(run_container_t **)prVar10;
          }
          if (uVar5 == '\x03') {
            uVar13 = run_container_cardinality(prVar10);
          }
          else {
            uVar13 = prVar10->n_runs;
          }
LAB_00129c7e:
          uVar14 = uVar14 + (long)(int)uVar13;
        }
        else if (uVar6 == uVar15) {
          prVar10 = (run_container_t *)(r->high_low_container).containers[uVar16];
          bVar4 = (r->high_low_container).typecodes[uVar16];
          if (bVar4 == 4) {
            bVar4 = *(byte *)&prVar10->runs;
            prVar10 = *(run_container_t **)prVar10;
          }
          if (bVar4 == 3) {
            uVar13 = run_container_rank(prVar10,uVar11);
          }
          else if (bVar4 == 2) {
            iVar7 = prVar10->n_runs + -1;
            uVar9 = 0;
            uVar13 = (uint)bVar4;
            do {
              if (iVar7 < (int)uVar9) {
                uVar8 = ~uVar9;
                break;
              }
              uVar8 = uVar9 + iVar7 >> 1;
              uVar1 = *(ushort *)((long)&prVar10->runs->value + (ulong)(uVar9 + iVar7 & 0xfffffffe))
              ;
              if (uVar1 < uVar11) {
                uVar9 = uVar8 + 1;
                bVar3 = true;
                uVar8 = uVar13;
              }
              else if (uVar11 < uVar1) {
                iVar7 = uVar8 - 1;
                bVar3 = true;
                uVar8 = uVar13;
              }
              else {
                bVar3 = false;
              }
              uVar13 = uVar8;
            } while (bVar3);
            uVar13 = ~uVar8;
            if (-1 < (int)uVar8) {
              uVar13 = uVar8 + 1;
            }
          }
          else {
            uVar13 = bitset_container_rank((bitset_container_t *)prVar10,uVar11);
          }
          goto LAB_00129c7e;
        }
      } while ((uVar15 < uVar6) && (uVar16 = uVar16 + 1, (int)uVar16 < (r->high_low_container).size)
              );
    }
  }
  else {
    uVar14 = 0;
  }
  return uVar14;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality(const roaring_bitmap_t *r,
                                          uint64_t range_start,
                                          uint64_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_end > UINT32_MAX) {
        range_end = UINT32_MAX + UINT64_C(1);
    }
    if (range_start >= range_end) {
        return 0;
    }
    range_end--;  // make range_end inclusive
    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}